

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O0

float Abc_SclComputeDelayClassPin(SC_Lib *p,SC_Cell *pRepr,int iPin,float Slew,float Gain)

{
  int iVar1;
  float fVar2;
  int local_3c;
  int local_38;
  int Count;
  int i;
  float Delay;
  SC_Cell *pCell;
  float Gain_local;
  float Slew_local;
  int iPin_local;
  SC_Cell *pRepr_local;
  SC_Lib *p_local;
  
  Count = 0;
  local_3c = 0;
  _i = pRepr;
  for (local_38 = 0; local_38 == 0 || _i != pRepr; local_38 = local_38 + 1) {
    if (_i->fSkip == 0) {
      fVar2 = Abc_SclComputeDelayCellPin(p,_i,iPin,Slew,Gain);
      Count = (int)(fVar2 + (float)Count);
      local_3c = local_3c + 1;
    }
    _i = _i->pNext;
  }
  iVar1 = Abc_MaxInt(1,local_3c);
  return (float)Count / (float)iVar1;
}

Assistant:

float Abc_SclComputeDelayClassPin( SC_Lib * p, SC_Cell * pRepr, int iPin, float Slew, float Gain )
{
    SC_Cell * pCell;
    float Delay = 0;
    int i, Count = 0;
    SC_RingForEachCell( pRepr, pCell, i )
    {
        if ( pCell->fSkip ) 
            continue;
//        if ( pRepr == pCell ) // skip the first gate
//            continue;
        Delay += Abc_SclComputeDelayCellPin( p, pCell, iPin, Slew, Gain );
        Count++;
    }
    return Delay / Abc_MaxInt(1, Count);
}